

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O0

string * __thiscall
pfederc::EnumExpr::toString_abi_cxx11_(string *__return_storage_ptr__,EnumExpr *this)

{
  Token *pTVar1;
  __tuple_element_t<0UL,_tuple<const_Token_*,_vector<unique_ptr<Expr,_default_delete<Expr>_>,_allocator<unique_ptr<Expr,_default_delete<Expr>_>_>_>_>_>
  pTVar2;
  bool bVar3;
  bool bVar4;
  Lexer *pLVar5;
  __tuple_element_t<0UL,_tuple<const_Token_*,_vector<unique_ptr<Expr,_default_delete<Expr>_>,_allocator<unique_ptr<Expr,_default_delete<Expr>_>_>_>_>_>
  *ppTVar6;
  __tuple_element_t<1UL,_tuple<const_Token_*,_vector<unique_ptr<Expr,_default_delete<Expr>_>,_allocator<unique_ptr<Expr,_default_delete<Expr>_>_>_>_>_>
  *this_00;
  pointer pEVar7;
  string local_f0 [32];
  reference local_d0;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *param;
  const_iterator __end3;
  const_iterator __begin3;
  __tuple_element_t<1UL,_tuple<const_Token_*,_vector<unique_ptr<Expr,_default_delete<Expr>_>,_allocator<unique_ptr<Expr,_default_delete<Expr>_>_>_>_>_>
  *__range3;
  bool first;
  __tuple_element_t<1UL,_tuple<const_Token_*,_vector<unique_ptr<Expr,_default_delete<Expr>_>,_allocator<unique_ptr<Expr,_default_delete<Expr>_>_>_>_>_>
  *params;
  reference local_80;
  tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
  *constructor;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
  *__range1;
  string local_40;
  allocator<char> local_1a;
  undefined1 local_19;
  EnumExpr *local_18;
  EnumExpr *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (EnumExpr *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"enum",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  bVar3 = std::
          vector<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>,_std::allocator<std::unique_ptr<pfederc::TemplateDecl,_std::default_delete<pfederc::TemplateDecl>_>_>_>
          ::empty(&this->templs);
  if (!bVar3) {
    _templateToString_abi_cxx11_(&local_40,&this->templs);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,' ');
  pTVar1 = this->tokId;
  pLVar5 = Expr::getLexer(&this->super_Expr);
  (*pTVar1->_vptr_Token[2])((string *)&__range1,pTVar1,pLVar5);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&__range1);
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
  __end1 = std::
           vector<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
           ::begin(&this->constructors);
  constructor = (tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                 *)std::
                   vector<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>
                   ::end(&this->constructors);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_*,_std::vector<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>_>
                                     *)&constructor), bVar3) {
    local_80 = __gnu_cxx::
               __normal_iterator<const_std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_*,_std::vector<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>_>
               ::operator*(&__end1);
    ppTVar6 = std::
              get<0ul,pfederc::Token_const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                        (local_80);
    pTVar2 = *ppTVar6;
    pLVar5 = Expr::getLexer(&this->super_Expr);
    (*pTVar2->_vptr_Token[2])((string *)&params,pTVar2,pLVar5);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&params);
    std::__cxx11::string::~string((string *)&params);
    this_00 = std::
              get<1ul,pfederc::Token_const*,std::vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>>
                        (local_80);
    bVar3 = std::
            vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
            ::empty(this_00);
    if (!bVar3) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'(');
      bVar3 = true;
      __end3 = std::
               vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
               ::begin(this_00);
      param = (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)
              std::
              vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
              ::end(this_00);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                                         *)&param), bVar4) {
        local_d0 = __gnu_cxx::
                   __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
                   ::operator*(&__end3);
        if (bVar3) {
          bVar3 = false;
        }
        else {
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
        }
        pEVar7 = std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::operator->
                           (local_d0);
        (*pEVar7->_vptr_Expr[2])();
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_f0);
        std::__cxx11::string::~string(local_f0);
        __gnu_cxx::
        __normal_iterator<const_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>
        ::operator++(&__end3);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,')');
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\n');
    __gnu_cxx::
    __normal_iterator<const_std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_*,_std::vector<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>,_std::allocator<std::tuple<const_pfederc::Token_*,_std::vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>_>_>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,';');
  return __return_storage_ptr__;
}

Assistant:

std::string EnumExpr::toString() const noexcept {
  std::string result = "enum";
  if (!templs.empty())
    result += _templateToString(templs);

  result += ' ';
  result += tokId->toString(getLexer());
  result += '\n';

  for (auto &constructor : constructors) {
    result += std::get<0>(constructor)->toString(getLexer());
    auto &params = std::get<1>(constructor);
    if (!params.empty()){
      result += '(';
      bool first = true;
      for (auto &param : params) {
        if (!first)
          result += ", ";
        else
          first = false;

        result += param->toString();
      }

      result += ')';
    }

    result += '\n';
  }

  result += ';';

  return result;
}